

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall amrex::AmrMesh::checkInput(AmrMesh *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Geometry *pGVar4;
  IntVect *pIVar5;
  int *piVar6;
  long lVar7;
  long in_RDI;
  Real RVar8;
  int min_grid_size;
  int bf_lev;
  int idim_3;
  int i_4;
  int idim_2;
  int i_3;
  IntVect bfrr;
  int i_2;
  int k;
  int idim_1;
  int i_1;
  int len;
  int idim;
  Box *domain;
  int i;
  undefined4 in_stack_fffffffffffff0f8;
  int in_stack_fffffffffffff0fc;
  Print *in_stack_fffffffffffff100;
  Print *this_00;
  RealBox *in_stack_fffffffffffff108;
  Print *in_stack_fffffffffffff110;
  Print *in_stack_fffffffffffff128;
  Print *in_stack_fffffffffffff130;
  Print *in_stack_fffffffffffff170;
  Print local_d48;
  int local_bbc;
  int local_a30;
  int local_a2c [3];
  int local_a20;
  int local_a1c;
  int local_704;
  int local_700;
  int local_6fc;
  int local_570 [2];
  int local_568;
  int local_55c;
  int iStack_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_220;
  int local_21c;
  Box *local_218;
  int local_20c;
  int local_1fc;
  IntVect *local_1f8;
  int local_1ec;
  IntVect *local_1e8;
  int local_1dc;
  IntVect *local_1d8;
  int local_1cc;
  IntVect *local_1c8;
  int local_1bc;
  IntVect *local_1b8;
  int local_1ac;
  IntVect *local_1a8;
  int local_19c;
  IntVect *local_198;
  int local_18c;
  IntVect *local_188;
  int local_17c;
  IntVect *local_178;
  int local_16c;
  IntVect *local_168;
  int local_15c;
  IntVect *local_158;
  int local_14c;
  IntVect *local_148;
  int local_13c;
  IntVect *local_138;
  int local_12c;
  IntVect *local_128;
  int local_11c;
  IntVect *local_118;
  int local_10c;
  IntVect *local_108;
  int local_fc;
  IntVect *local_f8;
  int local_ec;
  IntVect *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  int local_98 [2];
  int local_90;
  IntVect *local_88;
  IntVect *local_80;
  IntVect local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  IntVect *local_40;
  int *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  if (*(int *)(in_RDI + 0xc) < 0) {
    local_a0 = "checkInput: max_level not set";
    Error_host((char *)in_stack_fffffffffffff110);
  }
  for (local_20c = 0; local_20c < *(int *)(in_RDI + 0xc); local_20c = local_20c + 1) {
    iVar3 = MaxRefRatio((AmrMesh *)in_stack_fffffffffffff110,
                        (int)((ulong)in_stack_fffffffffffff108 >> 0x20));
    if (iVar3 < 2) {
      local_a8 = "Amr::checkInput: bad ref_ratios";
      Error_host((char *)in_stack_fffffffffffff110);
    }
  }
  pGVar4 = Geom((AmrMesh *)in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
  local_218 = Geometry::Domain(pGVar4);
  bVar2 = Box::ok(local_218);
  if (!bVar2) {
    local_b0 = "level 0 domain bad or not set";
    Error_host((char *)in_stack_fffffffffffff110);
  }
  for (local_21c = 0; local_21c < 3; local_21c = local_21c + 1) {
    local_220 = Box::length(local_218,local_21c);
    local_e8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffff100,
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
    local_ec = local_21c;
    iVar3 = local_e8->vect[local_21c];
    local_f8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffff100,
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
    iVar1 = local_220;
    local_fc = local_21c;
    if (iVar3 <= local_f8->vect[local_21c]) {
      local_108 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_10c = local_21c;
      if (iVar1 % local_108->vect[local_21c] != 0) {
        OutStream();
        Print::Print(in_stack_fffffffffffff130,(ostream *)in_stack_fffffffffffff128);
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [26])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [5])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::~Print(in_stack_fffffffffffff170);
        OutStream();
        Print::Print(in_stack_fffffffffffff130,(ostream *)in_stack_fffffffffffff128);
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [20])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_118 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff100,
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_11c = local_21c;
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::~Print(in_stack_fffffffffffff170);
        local_b8 = "domain size not divisible by blocking_factor";
        Error_host((char *)in_stack_fffffffffffff110);
      }
    }
  }
  for (local_544 = 0; local_544 <= *(int *)(in_RDI + 0xc); local_544 = local_544 + 1) {
    for (local_548 = 0; local_548 < 3; local_548 = local_548 + 1) {
      local_128 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_12c = local_548;
      for (local_54c = local_128->vect[local_548]; 0 < local_54c && local_54c % 2 == 0;
          local_54c = local_54c / 2) {
      }
      if (local_54c != 1) {
        local_c0 = 
        "Amr::checkInput: blocking_factor not power of 2. You can bypass this by setting ParmParse runtime parameter amr.check_input=0, although we do not recommend it."
        ;
        Error_host((char *)in_stack_fffffffffffff110);
      }
    }
  }
  for (local_550 = 0; local_550 < *(int *)(in_RDI + 0xc); local_550 = local_550 + 1) {
    pIVar5 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        in_stack_fffffffffffff100,
                        CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
    local_88 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffff100,
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
    local_4c = 0;
    local_5c = 1;
    local_6c = 2;
    local_80 = pIVar5;
    local_68 = local_88;
    local_58 = local_88;
    local_48 = local_88;
    IntVect::IntVect(&local_78,pIVar5->vect[0] * local_88->vect[0],
                     pIVar5->vect[1] * local_88->vect[1],pIVar5->vect[2] * local_88->vect[2]);
    local_90 = local_78.vect[2];
    local_98[0] = local_78.vect[0];
    local_98[1] = local_78.vect[1];
    local_568 = local_78.vect[2];
    local_570[0] = local_78.vect[0];
    local_570[1] = local_78.vect[1];
    local_55c = local_78.vect[0];
    iStack_558 = local_78.vect[1];
    local_554 = local_78.vect[2];
    local_40 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffff100,
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
    local_38 = &local_55c;
    local_c = 0;
    bVar2 = false;
    if (local_40->vect[0] <= local_55c) {
      local_1c = 1;
      bVar2 = false;
      local_18 = local_40;
      if (local_40->vect[1] <= iStack_558) {
        local_2c = 2;
        bVar2 = local_40->vect[2] <= local_554;
        local_28 = local_40;
      }
    }
    local_8 = local_40;
    if (!bVar2) {
      OutStream();
      Print::Print(in_stack_fffffffffffff130,(ostream *)in_stack_fffffffffffff128);
      Print::operator<<(in_stack_fffffffffffff100,
                        (char (*) [28])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8)
                       );
      Print::operator<<(in_stack_fffffffffffff100,
                        (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (char (*) [6])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
      ;
      local_6fc = local_550 + 1;
      Print::operator<<(in_stack_fffffffffffff100,
                        (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (char (*) [6])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
      ;
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_fffffffffffff100,
                 CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (IntVect *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (char (*) [2])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
      ;
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_fffffffffffff100,
                 CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (IntVect *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (char (*) [16])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8)
                       );
      Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                 in_stack_fffffffffffff100,
                 CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (IntVect *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::operator<<(in_stack_fffffffffffff100,
                        (char (*) [38])CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8)
                       );
      Print::operator<<(in_stack_fffffffffffff100,
                        (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                         *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      Print::~Print(in_stack_fffffffffffff170);
      local_c8 = "Blocking factors vary too much between levels";
      Error_host((char *)in_stack_fffffffffffff110);
    }
  }
  for (local_700 = 0; local_700 < *(int *)(in_RDI + 0xc); local_700 = local_700 + 1) {
    for (local_704 = 0; local_704 < 3; local_704 = local_704 + 1) {
      local_138 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_13c = local_704;
      iVar3 = local_138->vect[local_704];
      local_148 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_14c = local_704;
      if (iVar3 <= local_148->vect[local_704]) {
        local_158 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff100,
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_15c = local_704;
        iVar3 = local_158->vect[local_704];
        local_168 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff100,
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_16c = local_704;
        if (iVar3 % local_168->vect[local_704] != 0) {
          OutStream();
          Print::Print(in_stack_fffffffffffff130,(ostream *)in_stack_fffffffffffff128);
          Print::operator<<(in_stack_fffffffffffff100,
                            (char (*) [28])
                            CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          Print::operator<<(in_stack_fffffffffffff100,
                            (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          Print::operator<<(in_stack_fffffffffffff100,
                            (char (*) [5])
                            CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          local_178 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 in_stack_fffffffffffff100,
                                 CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          local_17c = local_704;
          Print::operator<<(in_stack_fffffffffffff100,
                            (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          Print::operator<<(in_stack_fffffffffffff100,
                            (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                             *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          Print::~Print(in_stack_fffffffffffff170);
          OutStream();
          Print::Print(in_stack_fffffffffffff130,(ostream *)in_stack_fffffffffffff128);
          Print::operator<<(in_stack_fffffffffffff100,
                            (char (*) [20])
                            CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          local_188 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                                ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                                 in_stack_fffffffffffff100,
                                 CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          local_18c = local_704;
          Print::operator<<(in_stack_fffffffffffff100,
                            (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          Print::operator<<(in_stack_fffffffffffff100,
                            (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                             *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
          Print::~Print(in_stack_fffffffffffff170);
          local_d0 = "max_grid_size not divisible by blocking_factor";
          Error_host((char *)in_stack_fffffffffffff110);
        }
      }
    }
  }
  for (local_a1c = 0; local_a1c < *(int *)(in_RDI + 0xc); local_a1c = local_a1c + 1) {
    for (local_a20 = 0; local_a20 < 3; local_a20 = local_a20 + 1) {
      local_a2c[1] = 1;
      local_198 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_19c = local_a20;
      iVar3 = local_198->vect[local_a20];
      local_1a8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_1ac = local_a20;
      local_a2c[0] = iVar3 / local_1a8->vect[local_a20];
      piVar6 = std::max<int>(local_a2c + 1,local_a2c);
      local_a2c[2] = *piVar6;
      local_1b8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_1bc = local_a20;
      lVar7 = (long)local_a20;
      piVar6 = local_1b8->vect;
      local_1c8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                             in_stack_fffffffffffff100,
                             CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
      local_1cc = local_a20;
      piVar6 = std::min<int>(piVar6 + lVar7,local_1c8->vect + local_a20);
      local_a30 = *piVar6;
      if (local_a30 % local_a2c[2] != 0) {
        OutStream();
        Print::Print(in_stack_fffffffffffff130,(ostream *)in_stack_fffffffffffff128);
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [10])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        in_stack_fffffffffffff170 =
             Print::operator<<(in_stack_fffffffffffff100,
                               (char (*) [15])
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [19])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_1d8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff100,
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_1dc = local_a20;
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [21])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_1e8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff100,
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_1ec = local_a20;
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [2])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [10])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_bbc = local_a1c + 1;
        in_stack_fffffffffffff130 =
             Print::operator<<(in_stack_fffffffffffff100,
                               (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
        ;
        in_stack_fffffffffffff128 =
             Print::operator<<(in_stack_fffffffffffff100,
                               (char (*) [15])
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::operator<<(in_stack_fffffffffffff100,
                          (char (*) [21])
                          CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_1f8 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                               in_stack_fffffffffffff100,
                               CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        local_1fc = local_a20;
        in_stack_fffffffffffff110 =
             Print::operator<<(in_stack_fffffffffffff100,
                               (int *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
        ;
        Print::operator<<(in_stack_fffffffffffff100,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
        Print::~Print(in_stack_fffffffffffff170);
        local_d8 = 
        "Coarse level blocking factor not a multiple of fine level blocking factor divided by ref ratio"
        ;
        Error_host((char *)in_stack_fffffffffffff110);
      }
    }
  }
  pGVar4 = Geom((AmrMesh *)in_stack_fffffffffffff100,in_stack_fffffffffffff0fc);
  Geometry::ProbDomain(pGVar4);
  RVar8 = RealBox::volume(in_stack_fffffffffffff108);
  if (RVar8 <= 0.0) {
    local_e0 = "Amr::checkInput: bad physical problem size";
    Error_host((char *)in_stack_fffffffffffff110);
  }
  if (0 < *(int *)(in_RDI + 8)) {
    OutStream();
    this_00 = &local_d48;
    Print::Print(in_stack_fffffffffffff130,(ostream *)in_stack_fffffffffffff128);
    Print::operator<<(this_00,(char (*) [35])
                              CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8));
    Print::operator<<(this_00,(char *)CONCAT44(in_stack_fffffffffffff0fc,in_stack_fffffffffffff0f8))
    ;
    Print::~Print(in_stack_fffffffffffff170);
  }
  return;
}

Assistant:

void
AmrMesh::checkInput ()
{
    if (max_level < 0)
        amrex::Error("checkInput: max_level not set");

    //
    // Check level dependent values.
    //
    for (int i = 0; i < max_level; i++)
    {
        if (MaxRefRatio(i) < 2)
            amrex::Error("Amr::checkInput: bad ref_ratios");
    }

    const Box& domain = Geom(0).Domain();
    if (!domain.ok())
        amrex::Error("level 0 domain bad or not set");

    //
    // Check that domain size is a multiple of blocking_factor[0].
    //   (only check if blocking_factor <= max_grid_size)
    //
    for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
    {
        int len = domain.length(idim);
        if (blocking_factor[0][idim] <= max_grid_size[0][idim])
           if (len%blocking_factor[0][idim] != 0)
           {
              amrex::Print() << "domain size in direction " << idim << " is " << len << std::endl;
              amrex::Print() << "blocking_factor is " << blocking_factor[0][idim] << std::endl;
              amrex::Error("domain size not divisible by blocking_factor");
           }
    }

    //
    // Check that blocking_factor is a power of 2.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            int k = blocking_factor[i][idim];
            while ( k > 0 && (k%2 == 0) )
                k /= 2;
            if (k != 1)
                amrex::Error("Amr::checkInput: blocking_factor not power of 2. You can bypass this by setting ParmParse runtime parameter amr.check_input=0, although we do not recommend it.");
        }
    }

    //
    // Check that blocking_factor does not vary too much between levels
    //
    for (int i = 0; i < max_level; i++) {
        const IntVect bfrr = blocking_factor[i] * ref_ratio[i];
        if (!bfrr.allGE(blocking_factor[i+1])) {
            amrex::Print() << "Blocking factors on levels " << i << " and " << i+1
                           << " are " << blocking_factor[i] << " " << blocking_factor[i+1]
                           << ". Ref ratio is " << ref_ratio[i]
                           << ".  They vary too much between levels." << std::endl;
            amrex::Error("Blocking factors vary too much between levels");
        }
    }

    //
    // Check that max_grid_size is a multiple of blocking_factor at every level.
    //   (only check if blocking_factor <= max_grid_size)
    //
    for (int i = 0; i < max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
           if (blocking_factor[i][idim] <= max_grid_size[i][idim])
              if (max_grid_size[i][idim]%blocking_factor[i][idim] != 0) {
              {
                 amrex::Print() << "max_grid_size in direction " << idim
                                << " is " << max_grid_size[i][idim] << std::endl;
                 amrex::Print() << "blocking_factor is " << blocking_factor[i][idim] << std::endl;
                 amrex::Error("max_grid_size not divisible by blocking_factor");
              }
            }
        }
    }

    // Make sure TagBoxArray has no overlapped valid cells after coarsening by block_factor/ref_ratio
    for (int i = 0; i < max_level; ++i) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            int bf_lev = std::max(1,blocking_factor[i+1][idim]/ref_ratio[i][idim]);
            int min_grid_size = std::min(blocking_factor[i][idim],max_grid_size[i][idim]);
            if (min_grid_size % bf_lev != 0) {
                amrex::Print() << "On level " << i << " in direction " << idim
                               << " max_grid_size is " << max_grid_size[i][idim]
                               << " blocking factor is " << blocking_factor[i][idim] << "\n"
                               << "On level " << i+1 << " in direction " << idim
                               << " blocking_factor is " << blocking_factor[i+1][idim] << std::endl;
                amrex::Error("Coarse level blocking factor not a multiple of fine level blocking factor divided by ref ratio");
            }
        }
    }

    if( ! (Geom(0).ProbDomain().volume() > 0.0) ) {
        amrex::Error("Amr::checkInput: bad physical problem size");
    }

    if(verbose > 0) {
        amrex::Print() << "Successfully read inputs file ... " << '\n';
    }
}